

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_stdout_and_stderr_to_file(void)

{
  uv_stdio_flags file_00;
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_218;
  char *local_210;
  undefined1 local_208 [8];
  uv_buf_t buf;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  uv_file file;
  int r;
  
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  file_00 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stdio[2].data,"stdout_file",0x42,0x180,
                       (uv_fs_cb)0x0);
  if (file_00 == ~UV_IGNORE) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x17f,"r != -1");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&stdio[2].data);
  options.stdio = (uv_stdio_container_t *)&buf.len;
  buf.len._0_4_ = 0;
  stdio[0].data.fd = 2;
  stdio[1].data.fd = 2;
  options.stdio_count = 3;
  stdio[1].flags = file_00;
  stdio[2].flags = file_00;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x18d,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,400,"r == 0");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x192,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x193,"close_cb_called == 1");
    abort();
  }
  uVar3 = uv_buf_init(output,0x400);
  local_218 = uVar3.base;
  local_208 = (undefined1  [8])local_218;
  local_210 = (char *)uVar3.len;
  buf.base = local_210;
  iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&stdio[2].data,file_00,(uv_buf_t *)local_208,1,0,
                     (uv_fs_cb)0x0);
  if (iVar1 != 0x1b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x197,"r == 27");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&stdio[2].data);
  iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stdio[2].data,file_00,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x19b,"r == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&stdio[2].data);
  printf("output is: %s",output);
  iVar1 = strcmp("hello world\nhello errworld\n",output);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x19f,"strcmp(\"hello world\\nhello errworld\\n\", output) == 0");
    abort();
  }
  unlink("stdout_file");
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x1a4,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 27);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\nhello errworld\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}